

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction_util.cpp
# Opt level: O2

UniValue * NormalizeOutputs(UniValue *__return_storage_ptr__,UniValue *outputs_in)

{
  VType VVar1;
  long lVar2;
  UniValue obj;
  UniValue *pUVar3;
  ulong index;
  long in_FS_OFFSET;
  string in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffee8 [56];
  string local_d0;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [16];
  UniValue outputs_dict;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  VVar1 = outputs_in->typ;
  if (VVar1 == VNULL) {
    pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&outputs_dict,"Invalid parameter, output argument must be non-null",
               (allocator<char> *)&local_d0);
    JSONRPCError(pUVar3,-8,(string *)&outputs_dict);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    if (VVar1 == VOBJ) {
      pUVar3 = UniValue::get_obj(outputs_in);
    }
    else {
      pUVar3 = UniValue::get_array(outputs_in);
    }
    UniValue::UniValue(__return_storage_ptr__,pUVar3);
    if (VVar1 != VOBJ) {
      local_b0 = local_a0;
      local_a8 = 0;
      local_a0[0] = 0;
      UniValue::UniValue(&outputs_dict,VOBJ,in_stack_fffffffffffffec8);
      std::__cxx11::string::~string((string *)&local_b0);
      for (index = 0;
          index < (ulong)(((long)(__return_storage_ptr__->values).
                                 super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(__return_storage_ptr__->values).
                                super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                                super__Vector_impl_data._M_start) / 0x58); index = index + 1) {
        pUVar3 = UniValue::operator[](__return_storage_ptr__,index);
        if (pUVar3->typ != VOBJ) {
          pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d0,
                     "Invalid parameter, key-value pair not an object as expected",
                     (allocator<char> *)&stack0xfffffffffffffed7);
          JSONRPCError(pUVar3,-8,&local_d0);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
            __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_002f0dd6;
        }
        if ((long)(pUVar3->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(pUVar3->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_start != 0x58) {
          pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d0,
                     "Invalid parameter, key-value pair must contain exactly one key",
                     (allocator<char> *)&stack0xfffffffffffffed7);
          JSONRPCError(pUVar3,-8,&local_d0);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
            __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_002f0dd6;
        }
        UniValue::UniValue((UniValue *)&stack0xfffffffffffffed8,pUVar3);
        obj._32_56_ = in_stack_fffffffffffffee8;
        obj._0_32_ = in_stack_fffffffffffffec8;
        UniValue::pushKVs(&outputs_dict,obj);
        UniValue::~UniValue((UniValue *)&stack0xfffffffffffffed8);
      }
      UniValue::operator=(__return_storage_ptr__,&outputs_dict);
      UniValue::~UniValue(&outputs_dict);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return __return_storage_ptr__;
    }
  }
LAB_002f0dd6:
  __stack_chk_fail();
}

Assistant:

UniValue NormalizeOutputs(const UniValue& outputs_in)
{
    if (outputs_in.isNull()) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, output argument must be non-null");
    }

    const bool outputs_is_obj = outputs_in.isObject();
    UniValue outputs = outputs_is_obj ? outputs_in.get_obj() : outputs_in.get_array();

    if (!outputs_is_obj) {
        // Translate array of key-value pairs into dict
        UniValue outputs_dict = UniValue(UniValue::VOBJ);
        for (size_t i = 0; i < outputs.size(); ++i) {
            const UniValue& output = outputs[i];
            if (!output.isObject()) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, key-value pair not an object as expected");
            }
            if (output.size() != 1) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, key-value pair must contain exactly one key");
            }
            outputs_dict.pushKVs(output);
        }
        outputs = std::move(outputs_dict);
    }
    return outputs;
}